

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_pcrv_tec_zone(REF_GRID ref_grid,REF_INT edgeid,REF_INT faceid,REF_INT sense,FILE *file)

{
  uint uVar1;
  REF_STATUS RVar2;
  uint uVar3;
  double local_1e0;
  REF_INT local_1d8;
  REF_INT local_1d4;
  double local_1d0;
  REF_INT local_1c8;
  REF_INT local_1c4;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL gap;
  REF_DBL xyz [3];
  REF_DBL local_128;
  REF_DBL normal [3];
  REF_DBL local_108;
  REF_DBL radius;
  REF_DBL tvalue;
  REF_DBL *uv;
  REF_DBL *t;
  int local_e0;
  REF_INT jump_geom;
  REF_INT sens;
  REF_INT nedg;
  REF_INT nnode;
  REF_INT node;
  REF_INT local;
  REF_INT item;
  REF_INT nodes [27];
  int local_54;
  REF_INT cell;
  REF_INT geom;
  REF_DICT ref_dict;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file_local;
  uint local_20;
  REF_INT sense_local;
  REF_INT faceid_local;
  REF_INT edgeid_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_geom = (REF_GEOM)ref_grid->cell[0];
  ref_dict = (REF_DICT)ref_grid->geom;
  t._4_4_ = -1;
  ref_node = (REF_NODE)file;
  file_local._4_4_ = sense;
  local_20 = faceid;
  sense_local = edgeid;
  _faceid_local = ref_grid;
  uVar1 = ref_dict_create((REF_DICT *)&cell);
  if (uVar1 == 0) {
    for (local_54 = 0; local_54 < ref_dict->max; local_54 = local_54 + 1) {
      if ((ref_dict->key[local_54 * 6] == 1) && (sense_local == ref_dict->key[local_54 * 6 + 1])) {
        uVar1 = ref_dict_store(_cell,ref_dict->key[local_54 * 6 + 5],local_54);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xc1c,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"mark nodes");
          return uVar1;
        }
        if (ref_dict->key[local_54 * 6 + 3] != 0) {
          if ((long)t._4_4_ != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xc1e,"ref_geom_pcrv_tec_zone","should be only one jump per edge",
                   0xffffffffffffffff,(long)t._4_4_);
            return 1;
          }
          t._4_4_ = local_54;
        }
      }
    }
    sens = _cell->n;
    if (t._4_4_ != -1) {
      sens = sens + 1;
    }
    jump_geom = 0;
    for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)&ref_geom->initial_cell_height + 4);
        nodes[0x1a] = nodes[0x1a] + 1) {
      RVar2 = ref_cell_nodes((REF_CELL)ref_geom,nodes[0x1a],&local);
      if ((RVar2 == 0) && (sense_local == nodes[0])) {
        jump_geom = jump_geom + 1;
      }
    }
    if ((sens == 0) || (jump_geom == 0)) {
      ref_grid_local._4_4_ = ref_dict_free(_cell);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xc2f,"ref_geom_pcrv_tec_zone",(ulong)ref_grid_local._4_4_,"free dict");
      }
    }
    else {
      fprintf((FILE *)ref_node,
              "zone t=\"pcrv%df%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)(uint)sense_local,(ulong)local_20,(ulong)(uint)sens,(ulong)(uint)jump_geom,
              "point","felineseg");
      if (sens < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xc38,"ref_geom_pcrv_tec_zone","malloc t of REF_DBL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        uv = (REF_DBL *)malloc((long)sens << 3);
        if (uv == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xc38,"ref_geom_pcrv_tec_zone","malloc t of REF_DBL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else if (sens * 2 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xc39,"ref_geom_pcrv_tec_zone","malloc uv of REF_DBL negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          tvalue = (REF_DBL)malloc((long)(sens << 1) << 3);
          if ((void *)tvalue == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xc39,"ref_geom_pcrv_tec_zone","malloc uv of REF_DBL NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)&ref_geom->initial_cell_height + 4);
                nodes[0x1a] = nodes[0x1a] + 1) {
              RVar2 = ref_cell_nodes((REF_CELL)ref_geom,nodes[0x1a],&local);
              if ((RVar2 == 0) && (sense_local == nodes[0])) {
                uVar1 = ref_dict_location(_cell,local,&nnode);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc40,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"localize");
                  printf("edg %d %d id %d no edge geom\n",(ulong)(uint)local,(ulong)(uint)item,
                         (ulong)(uint)nodes[0]);
                  uVar3 = ref_node_location((REF_NODE)ref_cell,local);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xc3e,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"loc");
                    return uVar3;
                  }
                  uVar3 = ref_geom_tattle((REF_GEOM)ref_dict,local);
                  if (uVar3 == 0) {
                    return uVar1;
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc3f,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"tatt");
                  return uVar3;
                }
                uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_dict,local,&local,1,&radius,&local_e0);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc43,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"from");
                  return uVar1;
                }
                if (local_e0 == -1) {
                  nnode = sens + -1;
                }
                uv[nnode] = radius;
                uVar1 = ref_egads_edge_face_uv
                                  ((REF_GEOM)ref_dict,sense_local,local_20,file_local._4_4_,
                                   uv[nnode],(REF_DBL *)((long)tvalue + (long)(nnode << 1) * 8));
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc48,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"p-curve uv");
                  return uVar1;
                }
                uVar1 = ref_dict_location(_cell,item,&nnode);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc49,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"localize");
                  return uVar1;
                }
                uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_dict,item,&local,1,&radius,&local_e0);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc4c,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"from");
                  return uVar1;
                }
                if (local_e0 == -1) {
                  nnode = sens + -1;
                }
                uv[nnode] = radius;
                uVar1 = ref_egads_edge_face_uv
                                  ((REF_GEOM)ref_dict,sense_local,local_20,file_local._4_4_,
                                   uv[nnode],(REF_DBL *)((long)tvalue + (long)(nnode << 1) * 8));
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc51,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"p-curve uv");
                  return uVar1;
                }
              }
            }
            node = 0;
            if (_cell->n < 1) {
              local_1c4 = -1;
            }
            else {
              local_1c4 = *_cell->key;
            }
            nedg = local_1c4;
            if (_cell->n < 1) {
              local_1c8 = -1;
            }
            else {
              local_1c8 = *_cell->value;
            }
            local_54 = local_1c8;
            while (node < _cell->n) {
              local_108 = 0.0;
              _ref_private_macro_code_rss_1 = 0.0;
              gap = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf) * 2);
              xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 1) * 2);
              xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 2) * 2);
              if (ref_dict[4].key != (REF_INT *)0x0) {
                uVar1 = ref_egads_edge_curvature((REF_GEOM)ref_dict,local_54,&local_108,&local_128);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc5c,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"curve");
                  return uVar1;
                }
                if (local_108 <= 0.0) {
                  local_1d0 = -local_108;
                }
                else {
                  local_1d0 = local_108;
                }
                local_108 = local_1d0;
                uVar1 = ref_egads_edge_face_uv
                                  ((REF_GEOM)ref_dict,sense_local,local_20,file_local._4_4_,uv[node]
                                   ,(REF_DBL *)((long)tvalue + (long)(node << 1) * 8));
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc60,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"p-curve uv");
                  return uVar1;
                }
                uVar1 = ref_egads_eval_at((REF_GEOM)ref_dict,2,local_20,
                                          (REF_DBL *)((long)tvalue + (long)(node << 1) * 8),&gap,
                                          (REF_DBL *)0x0);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc63,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"eval at");
                  return uVar1;
                }
                uVar1 = ref_egads_gap((REF_GEOM)ref_dict,nedg,
                                      (REF_DBL *)&ref_private_macro_code_rss_1);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc64,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"gap");
                  return uVar1;
                }
              }
              fprintf((FILE *)ref_node," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",gap,
                      xyz[0],xyz[1],_ref_private_macro_code_rss_1,
                      *(undefined8 *)((long)tvalue + (long)(node << 1) * 8),
                      *(undefined8 *)((long)tvalue + (long)(node * 2 + 1) * 8),local_108,uv[node]);
              node = node + 1;
              if ((node < 0) || (_cell->n <= node)) {
                local_1d4 = -1;
              }
              else {
                local_1d4 = _cell->key[node];
              }
              nedg = local_1d4;
              if ((node < 0) || (_cell->n <= node)) {
                local_1d8 = -1;
              }
              else {
                local_1d8 = _cell->value[node];
              }
              local_54 = local_1d8;
            }
            if (t._4_4_ != -1) {
              nedg = ref_dict->key[t._4_4_ * 6 + 5];
              local_108 = 0.0;
              _ref_private_macro_code_rss_1 = 0.0;
              gap = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf) * 2);
              xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 1) * 2);
              xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nedg * 0xf + 2) * 2);
              if (ref_dict[4].key != (REF_INT *)0x0) {
                uVar1 = ref_egads_edge_curvature((REF_GEOM)ref_dict,t._4_4_,&local_108,&local_128);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc73,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"curve");
                  return uVar1;
                }
                if (local_108 <= 0.0) {
                  local_1e0 = -local_108;
                }
                else {
                  local_1e0 = local_108;
                }
                local_108 = local_1e0;
                uVar1 = ref_egads_edge_face_uv
                                  ((REF_GEOM)ref_dict,sense_local,local_20,file_local._4_4_,
                                   uv[sens + -1],
                                   (REF_DBL *)((long)tvalue + (long)((sens + -1) * 2) * 8));
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc77,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"p-curve uv");
                  return uVar1;
                }
                uVar1 = ref_egads_eval_at((REF_GEOM)ref_dict,2,local_20,
                                          (REF_DBL *)((long)tvalue + (long)((sens + -1) * 2) * 8),
                                          &gap,(REF_DBL *)0x0);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc7a,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"eval at");
                  return uVar1;
                }
                uVar1 = ref_egads_gap((REF_GEOM)ref_dict,nedg,
                                      (REF_DBL *)&ref_private_macro_code_rss_1);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc7b,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"gap");
                  return uVar1;
                }
              }
              nedg = ref_dict->key[t._4_4_ * 6 + 5];
              fprintf((FILE *)ref_node," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",gap,
                      xyz[0],xyz[1],_ref_private_macro_code_rss_1,
                      *(undefined8 *)((long)tvalue + (long)((sens + -1) * 2) * 8),
                      *(undefined8 *)((long)tvalue + (long)((sens + -1) * 2 + 1) * 8),local_108,
                      uv[sens + -1]);
            }
            if (tvalue != 0.0) {
              free((void *)tvalue);
            }
            if (uv != (REF_DBL *)0x0) {
              free(uv);
            }
            for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)&ref_geom->initial_cell_height + 4);
                nodes[0x1a] = nodes[0x1a] + 1) {
              RVar2 = ref_cell_nodes((REF_CELL)ref_geom,nodes[0x1a],&local);
              if ((RVar2 == 0) && (sense_local == nodes[0])) {
                uVar1 = ref_dict_location(_cell,local,&nnode);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc87,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"localize");
                  return uVar1;
                }
                uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_dict,local,&local,1,&radius,&local_e0);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc8a,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"from");
                  return uVar1;
                }
                if (local_e0 == -1) {
                  nnode = sens + -1;
                }
                fprintf((FILE *)ref_node," %d",(ulong)(nnode + 1));
                uVar1 = ref_dict_location(_cell,item,&nnode);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc8d,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"localize");
                  return uVar1;
                }
                uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_dict,item,&local,1,&radius,&local_e0);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xc90,"ref_geom_pcrv_tec_zone",(ulong)uVar1,"from");
                  return uVar1;
                }
                if (local_e0 == -1) {
                  nnode = sens + -1;
                }
                fprintf((FILE *)ref_node," %d",(ulong)(nnode + 1));
                fprintf((FILE *)ref_node,"\n");
              }
            }
            ref_grid_local._4_4_ = ref_dict_free(_cell);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xc97,"ref_geom_pcrv_tec_zone",(ulong)ref_grid_local._4_4_,"free dict");
            }
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xc17,
           "ref_geom_pcrv_tec_zone",(ulong)uVar1,"create dict");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_pcrv_tec_zone(REF_GRID ref_grid, REF_INT edgeid,
                                          REF_INT faceid, REF_INT sense,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, nedg, sens;
  REF_INT jump_geom = REF_EMPTY;
  REF_DBL *t, *uv, tvalue;
  REF_DBL radius, normal[3], xyz[3], gap;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_edge(ref_geom, geom) {
    if (edgeid == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
      if (0 != ref_geom_jump(ref_geom, geom)) {
        REIS(REF_EMPTY, jump_geom, "should be only one jump per edge");
        jump_geom = geom;
      }
    }
  }
  nnode = ref_dict_n(ref_dict);
  if (REF_EMPTY != jump_geom) nnode++;

  nedg = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      nedg++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == nedg) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(file,
          "zone t=\"pcrv%df%d\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          edgeid, faceid, nnode, nedg, "point", "felineseg");

  ref_malloc(t, nnode, REF_DBL);
  ref_malloc(uv, 2 * nnode, REF_DBL);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      RSB(ref_dict_location(ref_dict, nodes[0], &local), "localize", {
        printf("edg %d %d id %d no edge geom\n", nodes[0], nodes[1], nodes[2]);
        RSS(ref_node_location(ref_node, nodes[0]), "loc");
        RSS(ref_geom_tattle(ref_geom, nodes[0]), "tatt");
      });
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[local],
                                 &(uv[2 * local])),
          "p-curve uv");
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[local],
                                 &(uv[2 * local])),
          "p-curve uv");
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, geom, &radius, normal), "curve");
      radius = ABS(radius);
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[item],
                                 &(uv[2 * item])),
          "p-curve uv");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid, &(uv[2 * item]),
                            xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * item], uv[1 + 2 * item], radius,
            t[item]);
  }
  if (REF_EMPTY != jump_geom) {
    node = ref_geom_node(ref_geom, jump_geom);
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, jump_geom, &radius, normal),
          "curve");
      radius = ABS(radius);
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[nnode - 1],
                                 &(uv[2 * (nnode - 1)])),
          "p-curve uv");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid,
                            &(uv[2 * (nnode - 1)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    node = ref_geom_node(ref_geom, jump_geom);
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode - 1)],
            uv[1 + 2 * (nnode - 1)], radius, t[nnode - 1]);
  }
  ref_free(uv);
  ref_free(t);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      RSS(ref_dict_location(ref_dict, nodes[0], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}